

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void evsig_cb(int fd,short what,void *arg)

{
  byte bVar1;
  int *piVar2;
  uint8_t sig;
  int err;
  event_base *base;
  int ncaught [65];
  int i;
  ssize_t n;
  void *arg_local;
  short what_local;
  int fd_local;
  
  memset(&base,0,0x104);
  while( true ) {
    register0x00000000 = read(fd,evsig_cb::signals,0x400);
    if (register0x00000000 == -1) break;
    if (register0x00000000 == 0) goto LAB_00460b3a;
    for (ncaught[0x3f] = 0; ncaught[0x3f] < register0x00000000; ncaught[0x3f] = ncaught[0x3f] + 1) {
      bVar1 = evsig_cb::signals[ncaught[0x3f]];
      if (bVar1 < 0x41) {
        ncaught[(ulong)bVar1 - 2] = ncaught[(ulong)bVar1 - 2] + 1;
      }
    }
  }
  piVar2 = __errno_location();
  if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
    event_sock_err(1,fd,"%s: recv","evsig_cb");
  }
LAB_00460b3a:
  if (*(long *)((long)arg + 0x1b0) != 0) {
    (*evthread_lock_fns_.lock)(0,*(void **)((long)arg + 0x1b0));
  }
  for (ncaught[0x3f] = 0; ncaught[0x3f] < 0x41; ncaught[0x3f] = ncaught[0x3f] + 1) {
    if (ncaught[(long)ncaught[0x3f] + -2] != 0) {
      evmap_signal_active_((event_base *)arg,ncaught[0x3f],ncaught[(long)ncaught[0x3f] + -2]);
    }
  }
  if (*(long *)((long)arg + 0x1b0) != 0) {
    (*evthread_lock_fns_.unlock)(0,*(void **)((long)arg + 0x1b0));
  }
  return;
}

Assistant:

static void
evsig_cb(evutil_socket_t fd, short what, void *arg)
{
	static char signals[1024];
	ev_ssize_t n;
	int i;
	int ncaught[NSIG];
	struct event_base *base;

	base = arg;

	memset(&ncaught, 0, sizeof(ncaught));

	while (1) {
#ifdef _WIN32
		n = recv(fd, signals, sizeof(signals), 0);
#else
		n = read(fd, signals, sizeof(signals));
#endif
		if (n == -1) {
			int err = evutil_socket_geterror(fd);
			if (! EVUTIL_ERR_RW_RETRIABLE(err))
				event_sock_err(1, fd, "%s: recv", __func__);
			break;
		} else if (n == 0) {
			/* XXX warn? */
			break;
		}
		for (i = 0; i < n; ++i) {
			ev_uint8_t sig = signals[i];
			if (sig < NSIG)
				ncaught[sig]++;
		}
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	for (i = 0; i < NSIG; ++i) {
		if (ncaught[i])
			evmap_signal_active_(base, i, ncaught[i]);
	}
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}